

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O0

void deqp::gls::StateQueryUtil::queryIndexedState
               (ResultCollector *result,CallLogWrapper *gl,QueryType type,GLenum target,int index,
               QueriedState *state)

{
  bool bVar1;
  GLboolean v;
  uchar (*pauVar2) [4];
  int (*paiVar3) [4];
  long (*palVar4) [4];
  uchar *puVar5;
  int *piVar6;
  long *plVar7;
  QueriedState local_228;
  undefined1 local_200 [8];
  StateQueryMemoryWriteGuard<long> value_6;
  undefined1 local_1bc [8];
  StateQueryMemoryWriteGuard<int> value_5;
  StateQueryMemoryWriteGuard<unsigned_char> local_183;
  undefined1 local_180 [5];
  StateQueryMemoryWriteGuard<unsigned_char> value_4;
  undefined1 local_150 [7];
  GLboolean value_3;
  undefined1 local_128 [8];
  StateQueryMemoryWriteGuard<long[4]> value_2;
  undefined1 local_a0 [8];
  StateQueryMemoryWriteGuard<int[4]> value_1;
  int local_44;
  bool local_40 [4];
  int i;
  bool res [4];
  StateQueryMemoryWriteGuard<unsigned_char[4]> value;
  QueriedState *state_local;
  int index_local;
  GLenum target_local;
  QueryType type_local;
  CallLogWrapper *gl_local;
  ResultCollector *result_local;
  
  switch(type) {
  case QUERY_INDEXED_BOOLEAN:
    StateQueryMemoryWriteGuard<unsigned_char>::StateQueryMemoryWriteGuard(&local_183);
    puVar5 = StateQueryMemoryWriteGuard<unsigned_char>::operator&(&local_183);
    glu::CallLogWrapper::glGetBooleani_v(gl,target,index,puVar5);
    bVar1 = checkError(result,gl,"glGetBooleani_v");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<unsigned_char>::verifyValidity(&local_183,result), bVar1)
       ) {
      puVar5 = StateQueryMemoryWriteGuard::operator_cast_to_unsigned_char_
                         ((StateQueryMemoryWriteGuard *)&local_183);
      bVar1 = verifyBooleanValidity(result,*puVar5);
      if (bVar1) {
        puVar5 = StateQueryMemoryWriteGuard::operator_cast_to_unsigned_char_
                           ((StateQueryMemoryWriteGuard *)&local_183);
        QueriedState::QueriedState((QueriedState *)&value_5.m_value,*puVar5 == '\x01');
        memcpy(state,&value_5.m_value,0x28);
      }
    }
    break;
  case QUERY_INDEXED_BOOLEAN_VEC4:
    StateQueryMemoryWriteGuard<unsigned_char[4]>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<unsigned_char[4]> *)&i);
    pauVar2 = StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                        ((StateQueryMemoryWriteGuard *)&i);
    glu::CallLogWrapper::glGetBooleani_v(gl,target,index,*pauVar2);
    bVar1 = checkError(result,gl,"glGetBooleani_v");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<unsigned_char[4]>::verifyValidity
                          ((StateQueryMemoryWriteGuard<unsigned_char[4]> *)&i,result), bVar1)) {
      pauVar2 = StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                          ((StateQueryMemoryWriteGuard *)&i);
      bVar1 = verifyBooleanVec4Validity(result,*pauVar2);
      if (bVar1) {
        for (local_44 = 0; local_44 < 4; local_44 = local_44 + 1) {
          pauVar2 = StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                              ((StateQueryMemoryWriteGuard *)&i);
          local_40[local_44] = (*pauVar2)[local_44] == '\x01';
        }
        QueriedState::QueriedState((QueriedState *)(value_1.m_postguard + 2),&local_40);
        memcpy(state,value_1.m_postguard + 2,0x28);
      }
    }
    break;
  case QUERY_INDEXED_ISENABLED:
    v = glu::CallLogWrapper::glIsEnabledi(gl,target,index);
    bVar1 = checkError(result,gl,"glIsEnabledi");
    if ((bVar1) && (bVar1 = verifyBooleanValidity(result,v), bVar1)) {
      QueriedState::QueriedState((QueriedState *)local_180,v == '\x01');
      memcpy(state,local_180,0x28);
    }
    break;
  case QUERY_INDEXED_INTEGER:
    StateQueryMemoryWriteGuard<int>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int> *)local_1bc);
    piVar6 = StateQueryMemoryWriteGuard<int>::operator&
                       ((StateQueryMemoryWriteGuard<int> *)local_1bc);
    glu::CallLogWrapper::glGetIntegeri_v(gl,target,index,piVar6);
    bVar1 = checkError(result,gl,"glGetIntegeri_v");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<int>::verifyValidity
                          ((StateQueryMemoryWriteGuard<int> *)local_1bc,result), bVar1)) {
      piVar6 = StateQueryMemoryWriteGuard::operator_cast_to_int_
                         ((StateQueryMemoryWriteGuard *)local_1bc);
      QueriedState::QueriedState((QueriedState *)&value_6.m_postguard,*piVar6);
      memcpy(state,&value_6.m_postguard,0x28);
    }
    break;
  case QUERY_INDEXED_INTEGER_VEC4:
    StateQueryMemoryWriteGuard<int[4]>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<int[4]> *)local_a0);
    paiVar3 = StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                        ((StateQueryMemoryWriteGuard *)local_a0);
    glu::CallLogWrapper::glGetIntegeri_v(gl,target,index,*paiVar3);
    bVar1 = checkError(result,gl,"glGetIntegeri_v");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<int[4]>::verifyValidity
                          ((StateQueryMemoryWriteGuard<int[4]> *)local_a0,result), bVar1)) {
      paiVar3 = StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                          ((StateQueryMemoryWriteGuard *)local_a0);
      QueriedState::QueriedState((QueriedState *)(value_2.m_postguard + 3),(GLIntVec4 *)paiVar3);
      memcpy(state,value_2.m_postguard + 3,0x28);
    }
    break;
  case QUERY_INDEXED_INTEGER64:
    StateQueryMemoryWriteGuard<long>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<long> *)local_200);
    plVar7 = StateQueryMemoryWriteGuard<long>::operator&
                       ((StateQueryMemoryWriteGuard<long> *)local_200);
    glu::CallLogWrapper::glGetInteger64i_v(gl,target,index,plVar7);
    bVar1 = checkError(result,gl,"glGetInteger64i_v");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<long>::verifyValidity
                          ((StateQueryMemoryWriteGuard<long> *)local_200,result), bVar1)) {
      plVar7 = StateQueryMemoryWriteGuard::operator_cast_to_long_
                         ((StateQueryMemoryWriteGuard *)local_200);
      QueriedState::QueriedState(&local_228,*plVar7);
      memcpy(state,&local_228,0x28);
    }
    break;
  case QUERY_INDEXED_INTEGER64_VEC4:
    StateQueryMemoryWriteGuard<long[4]>::StateQueryMemoryWriteGuard
              ((StateQueryMemoryWriteGuard<long[4]> *)local_128);
    palVar4 = StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                        ((StateQueryMemoryWriteGuard *)local_128);
    glu::CallLogWrapper::glGetInteger64i_v(gl,target,index,*palVar4);
    bVar1 = checkError(result,gl,"glGetInteger64i_v");
    if ((bVar1) &&
       (bVar1 = StateQueryMemoryWriteGuard<long[4]>::verifyValidity
                          ((StateQueryMemoryWriteGuard<long[4]> *)local_128,result), bVar1)) {
      palVar4 = StateQueryMemoryWriteGuard::operator_cast_to_function_pointer
                          ((StateQueryMemoryWriteGuard *)local_128);
      QueriedState::QueriedState((QueriedState *)local_150,(GLInt64Vec4 *)palVar4);
      memcpy(state,local_150,0x28);
    }
  }
  return;
}

Assistant:

void queryIndexedState (tcu::ResultCollector& result, glu::CallLogWrapper& gl, QueryType type, glw::GLenum target, int index, QueriedState& state)
{
	switch (type)
	{
		case QUERY_INDEXED_BOOLEAN_VEC4:
		{
			StateQueryMemoryWriteGuard<glw::GLboolean[4]> value;
			gl.glGetBooleani_v(target, index, value);

			if (!checkError(result, gl, "glGetBooleani_v"))
				return;

			if (!value.verifyValidity(result))
				return;

			if (!verifyBooleanVec4Validity(result, value))
				return;

			{
				bool res[4];

				for (int i = 0; i < 4; i++)
					res[i] = value[i] == GL_TRUE;

				state = QueriedState(res);
			}

			break;
		}

		case QUERY_INDEXED_INTEGER_VEC4:
		{
			StateQueryMemoryWriteGuard<glw::GLint[4]> value;
			gl.glGetIntegeri_v(target, index, value);

			if (!checkError(result, gl, "glGetIntegeri_v"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}

		case QUERY_INDEXED_INTEGER64_VEC4:
		{
			StateQueryMemoryWriteGuard<glw::GLint64[4]> value;
			gl.glGetInteger64i_v(target, index, value);

			if (!checkError(result, gl, "glGetInteger64i_v"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}

		case QUERY_INDEXED_ISENABLED:
		{
			const glw::GLboolean value = gl.glIsEnabledi(target, index);

			if (!checkError(result, gl, "glIsEnabledi"))
				return;

			if (!verifyBooleanValidity(result, value))
				return;

			state = QueriedState(value == GL_TRUE);
			break;
		}

		case QUERY_INDEXED_BOOLEAN:
		{
			StateQueryMemoryWriteGuard<glw::GLboolean> value;
			gl.glGetBooleani_v(target, index, &value);

			if (!checkError(result, gl, "glGetBooleani_v"))
				return;

			if (!value.verifyValidity(result))
				return;
			if (!verifyBooleanValidity(result, value))
				return;

			state = QueriedState(value == GL_TRUE);
			break;
		}

		case QUERY_INDEXED_INTEGER:
		{
			StateQueryMemoryWriteGuard<glw::GLint> value;
			gl.glGetIntegeri_v(target, index, &value);

			if (!checkError(result, gl, "glGetIntegeri_v"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}

		case QUERY_INDEXED_INTEGER64:
		{
			StateQueryMemoryWriteGuard<glw::GLint64> value;
			gl.glGetInteger64i_v(target, index, &value);

			if (!checkError(result, gl, "glGetInteger64i_v"))
				return;

			if (!value.verifyValidity(result))
				return;

			state = QueriedState(value);
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
			break;
	}
}